

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# resourcefile.cpp
# Opt level: O1

int __thiscall
FResourceFile::FilterLumpsByGameType
          (FResourceFile *this,int type,void *lumps,size_t lumpsize,DWORD max)

{
  int iVar1;
  int iVar2;
  char *copyStr;
  long lVar3;
  FString filter;
  FString local_58;
  FString local_50;
  void *local_48;
  size_t local_40;
  FString local_38;
  
  if (type == 0) {
    iVar1 = 0;
  }
  else {
    lVar3 = 0;
    copyStr = "game-Raven";
    iVar2 = 0;
    local_48 = lumps;
    local_40 = lumpsize;
    do {
      if ((*(uint *)((long)&FilterLumpsByGameType::blanket[0].match + lVar3) & type) != 0) {
        FString::FString(&local_38,copyStr);
        iVar1 = FilterLumps(this,&local_38,local_48,local_40,max);
        iVar2 = iVar2 + iVar1;
        FString::~FString(&local_38);
      }
      copyStr = *(char **)((long)&FilterLumpsByGameType::blanket[1].name + lVar3);
      lVar3 = lVar3 + 0x10;
    } while (lVar3 != 0x30);
    FString::FString(&local_50,"game-");
    FString::operator+=(&local_50,GameNames[type]);
    FString::AttachToOther(&local_58,&local_50);
    iVar1 = FilterLumps(this,&local_58,local_48,local_40,max);
    iVar1 = iVar1 + iVar2;
    FString::~FString(&local_58);
    FString::~FString(&local_50);
  }
  return iVar1;
}

Assistant:

int FResourceFile::FilterLumpsByGameType(int type, void *lumps, size_t lumpsize, DWORD max)
{
	static const struct { int match; const char *name; } blanket[] =
	{
		{ GAME_Raven,			"game-Raven" },
		{ GAME_DoomStrifeChex,	"game-DoomStrifeChex" },
		{ GAME_DoomChex,		"game-DoomChex" },
		{ GAME_Any, NULL }
	};
	if (type == 0)
	{
		return 0;
	}
	int count = 0;
	for (int i = 0; blanket[i].name != NULL; ++i)
	{
		if (type & blanket[i].match)
		{
			count += FilterLumps(blanket[i].name, lumps, lumpsize, max);
		}
	}
	FString filter = "game-";
	filter += GameNames[type];
	return count + FilterLumps(filter, lumps, lumpsize, max);
}